

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Split * wasm::String::handleBracketingOperators(Split *__return_storage_ptr__,Split *split)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *part;
  pointer pbVar2;
  Fatal local_238;
  string local_b0;
  undefined1 local_90 [8];
  anon_class_24_3_616f249e handlePart;
  string last;
  int local_34 [2];
  int nesting;
  
  if (split->needToHandleBracketingOperations == false) {
    Split::Split(__return_storage_ptr__,split);
  }
  else {
    (__return_storage_ptr__->
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->needToHandleBracketingOperations = true;
    handlePart.ret = (Split *)&last._M_string_length;
    last._M_dataplus._M_p = (pointer)0x0;
    last._M_string_length._0_1_ = 0;
    local_90 = (undefined1  [8])local_34;
    local_34[0] = 0;
    handlePart.nesting = (int *)&handlePart.ret;
    pbVar1 = (split->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    handlePart.last = (string *)__return_storage_ptr__;
    for (pbVar2 = (split->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1)
    {
      std::__cxx11::string::string((string *)&local_b0,(string *)pbVar2);
      handleBracketingOperators::anon_class_24_3_616f249e::operator()
                ((anon_class_24_3_616f249e *)local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(last.field_2._M_local_buf + 8),"",(allocator<char> *)&local_238);
    handleBracketingOperators::anon_class_24_3_616f249e::operator()
              ((anon_class_24_3_616f249e *)local_90,(string *)((long)&last.field_2 + 8));
    std::__cxx11::string::~string((string *)(last.field_2._M_local_buf + 8));
    if (local_34[0] != 0) {
      Fatal::Fatal(&local_238);
      Fatal::operator<<(&local_238,(char (*) [32])"Asyncify: failed to parse lists");
      Fatal::~Fatal(&local_238);
    }
    std::__cxx11::string::~string((string *)&handlePart.ret);
  }
  return __return_storage_ptr__;
}

Assistant:

Split handleBracketingOperators(Split split) {
  if (!split.needToHandleBracketingOperations) {
    return split;
  }

  Split ret;
  std::string last;
  int nesting = 0;
  auto handlePart = [&](std::string part) {
    if (part.empty()) {
      return;
    }
    for (const char c : part) {
      if (c == '(' || c == '<' || c == '[' || c == '{') {
        nesting++;
      } else if (c == ')' || c == '>' || c == ']' || c == '}') {
        nesting--;
      }
    }
    if (last.empty()) {
      last = part;
    } else {
      last += ',' + part;
    }
    if (nesting == 0) {
      ret.push_back(last);
      last.clear();
    }
  };
  for (auto& part : split) {
    handlePart(part);
  }
  handlePart("");
  if (nesting != 0) {
    Fatal() << "Asyncify: failed to parse lists";
  }
  return ret;
}